

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O2

Matrix<float,_3,_3> *
math::matrix_inverse<float>
          (Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_3> *m,float *det)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 local_34 [8];
  Matrix<float,_3,_3> ret;
  
  fVar1 = m->m[8];
  fVar2 = m->m[4];
  fVar3 = m->m[5];
  fVar4 = m->m[7];
  local_34._0_4_ = fVar2 * fVar1 - fVar4 * fVar3;
  fVar5 = m->m[1];
  fVar6 = m->m[2];
  local_34._4_4_ = fVar6 * fVar4 - fVar1 * fVar5;
  ret.m[0] = fVar5 * fVar3 - fVar2 * fVar6;
  fVar7 = m->m[3];
  fVar8 = m->m[6];
  ret.m[1] = fVar3 * fVar8 - fVar1 * fVar7;
  fVar9 = m->m[0];
  ret.m[2] = fVar1 * fVar9 - fVar8 * fVar6;
  ret.m[3] = fVar6 * fVar7 - fVar3 * fVar9;
  ret.m[4] = fVar7 * fVar4 - fVar8 * fVar2;
  ret.m[5] = fVar5 * fVar8 - fVar4 * fVar9;
  ret.m[6] = fVar9 * fVar2 - fVar7 * fVar5;
  Matrix<float,_3,_3>::operator/(__return_storage_ptr__,(Matrix<float,_3,_3> *)local_34,det);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T,3,3>
matrix_inverse (Matrix<T,3,3> const& m, T const& det)
{
    Matrix<T,3,3> ret;
    ret[0] = m[4] * m[8] - m[5] * m[7];
    ret[1] = m[2] * m[7] - m[1] * m[8];
    ret[2] = m[1] * m[5] - m[2] * m[4];
    ret[3] = m[5] * m[6] - m[3] * m[8];
    ret[4] = m[0] * m[8] - m[2] * m[6];
    ret[5] = m[2] * m[3] - m[0] * m[5];
    ret[6] = m[3] * m[7] - m[4] * m[6];
    ret[7] = m[1] * m[6] - m[0] * m[7];
    ret[8] = m[0] * m[4] - m[1] * m[3];
    return ret / det;
}